

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool ON_OrderEdgesAroundVertex(ON_Brep *B,int vid,ON_2dex *trim_ends,bool *bClosed)

{
  int iVar1;
  ON_BrepVertex *pOVar2;
  int *piVar3;
  ON_BrepEdge *pOVar4;
  bool local_59;
  ON_BrepEdge *E;
  int i;
  ON_BrepVertex *V;
  bool *bClosed_local;
  ON_2dex *trim_ends_local;
  int vid_local;
  ON_Brep *B_local;
  
  *bClosed = false;
  if (vid < 0) {
    B_local._7_1_ = false;
  }
  else {
    pOVar2 = ON_ClassArray<ON_BrepVertex>::operator[]((ON_ClassArray<ON_BrepVertex> *)&B->m_V,vid);
    if (pOVar2->m_vertex_index < 0) {
      B_local._7_1_ = false;
    }
    else {
      *bClosed = true;
      for (E._4_4_ = 0; iVar1 = ON_SimpleArray<int>::Count(&pOVar2->m_ei), E._4_4_ < iVar1;
          E._4_4_ = E._4_4_ + 1) {
        piVar3 = ON_SimpleArray<int>::operator[](&pOVar2->m_ei,E._4_4_);
        pOVar4 = ON_ClassArray<ON_BrepEdge>::operator[]
                           ((ON_ClassArray<ON_BrepEdge> *)&B->m_E,*piVar3);
        iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti);
        if (iVar1 != 2) {
          iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti);
          if (iVar1 != 1) {
            return false;
          }
          *bClosed = false;
          break;
        }
      }
      if ((*bClosed & 1U) == 0) {
        local_59 = OrderEdgesAroundOpenVertex(B,vid,trim_ends);
      }
      else {
        local_59 = OrderEdgesAroundClosedVertex(B,vid,trim_ends);
      }
      B_local._7_1_ = local_59;
    }
  }
  return B_local._7_1_;
}

Assistant:

bool ON_OrderEdgesAroundVertex(const ON_Brep& B, int vid,
                               ON_2dex* trim_ends,//Must be at as big as the edge count at the vertex
                               bool& bClosed)

{
  bClosed = false;
  if (vid<0)
    return false;
  const ON_BrepVertex& V = B.m_V[vid];
  if (V.m_vertex_index < 0)
    return false;
  int i;
  bClosed = true;
  for (i=0; i<V.m_ei.Count(); i++){
    const ON_BrepEdge& E = B.m_E[V.m_ei[i]];
    if (E.m_ti.Count() == 2)
      continue;
    if (E.m_ti.Count() == 1){
      bClosed = false;
      break;
    }
    return false;
  }
  return (bClosed) ? 
    OrderEdgesAroundClosedVertex(B, vid, trim_ends) : OrderEdgesAroundOpenVertex(B, vid, trim_ends);
}